

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O0

void archive_string_vsprintf(archive_string *as,char *fmt,__va_list_tag *ap)

{
  char cVar1;
  char *pcVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  char *pcVar5;
  int *piVar6;
  archive_string *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *saved_p;
  wchar_t *pw;
  char *p2;
  char *p;
  uintmax_t u;
  intmax_t s;
  char long_flag;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  char c;
  archive_string *in_stack_fffffffffffffe60;
  uint uVar7;
  archive_string *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  wchar_t *in_stack_fffffffffffffe90;
  archive_string *in_stack_fffffffffffffe98;
  long *local_130;
  long *local_f0;
  wchar_t *local_48;
  char *local_38;
  char local_19;
  
  paVar4 = archive_string_ensure(in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
  if (paVar4 == (archive_string *)0x0) {
    __archive_errx(in_stack_fffffffffffffe74,(char *)in_stack_fffffffffffffe68);
  }
  local_38 = in_RSI;
  if (in_RSI == (char *)0x0) {
    *(undefined1 *)*in_RDI = 0;
  }
  else {
    for (; pcVar2 = local_38, *local_38 != '\0'; local_38 = local_38 + 1) {
      c = (char)((uint)in_stack_fffffffffffffe5c >> 0x18);
      if (*local_38 == '%') {
        pcVar5 = local_38 + 1;
        local_19 = '\0';
        cVar1 = *pcVar5;
        if (((cVar1 == 'j') || (cVar1 == 'l')) || (cVar1 == 'z')) {
          local_19 = *pcVar5;
          pcVar5 = local_38 + 2;
        }
        local_38 = pcVar5;
        switch(*local_38) {
        case '%':
          archive_strappend_char(in_stack_fffffffffffffe60,c);
          break;
        default:
          archive_strappend_char(in_stack_fffffffffffffe60,c);
          local_38 = pcVar2;
          break;
        case 'S':
          uVar7 = *(uint *)&in_RDX->s;
          if (uVar7 < 0x29) {
            local_130 = (long *)((long)(int)uVar7 + in_RDX->buffer_length);
            *(uint *)&in_RDX->s = uVar7 + 8;
          }
          else {
            local_130 = (long *)in_RDX->length;
            in_RDX->length = (size_t)(local_130 + 1);
          }
          local_48 = (wchar_t *)*local_130;
          if (local_48 == (wchar_t *)0x0) {
            local_48 = anon_var_dwarf_11536;
          }
          wcslen(local_48);
          wVar3 = archive_string_append_from_wcs
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          if ((wVar3 != L'\0') && (piVar6 = __errno_location(), *piVar6 == 0xc)) {
            __archive_errx(in_stack_fffffffffffffe74,(char *)in_stack_fffffffffffffe68);
          }
          break;
        case 'X':
        case 'o':
        case 'u':
        case 'x':
          if (local_19 == 'j') {
            if (*(uint *)&in_RDX->s < 0x29) {
              *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
          }
          else if (local_19 == 'l') {
            uVar7 = *(uint *)&in_RDX->s;
            in_stack_fffffffffffffe98 = in_RDX;
            if (uVar7 < 0x29) {
              in_stack_fffffffffffffe90 = (wchar_t *)((long)(int)uVar7 + in_RDX->buffer_length);
              *(uint *)&in_RDX->s = uVar7 + 8;
            }
            else {
              in_stack_fffffffffffffe90 = (wchar_t *)in_RDX->length;
              in_RDX->length = (size_t)(in_stack_fffffffffffffe90 + 2);
            }
          }
          else if (local_19 == 'z') {
            in_stack_fffffffffffffe8c = *(uint *)&in_RDX->s;
            if (in_stack_fffffffffffffe8c < 0x29) {
              *(uint *)&in_RDX->s = in_stack_fffffffffffffe8c + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
          }
          else {
            in_stack_fffffffffffffe74 = *(uint *)&in_RDX->s;
            in_stack_fffffffffffffe68 = in_RDX;
            if (in_stack_fffffffffffffe74 < 0x29) {
              in_stack_fffffffffffffe60 =
                   (archive_string *)((long)(int)in_stack_fffffffffffffe74 + in_RDX->buffer_length);
              *(uint *)&in_RDX->s = in_stack_fffffffffffffe74 + 8;
            }
            else {
              in_stack_fffffffffffffe60 = (archive_string *)in_RDX->length;
              in_RDX->length = (size_t)&in_stack_fffffffffffffe60->length;
            }
          }
          in_stack_fffffffffffffe5c = (int)*local_38;
          uVar7 = (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20);
          if (in_stack_fffffffffffffe5c == 0x6f) {
            append_uint((archive_string *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        (uintmax_t)in_stack_fffffffffffffe68,uVar7);
          }
          else if (in_stack_fffffffffffffe5c == 0x75) {
            append_uint((archive_string *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        (uintmax_t)in_stack_fffffffffffffe68,uVar7);
          }
          else {
            append_uint((archive_string *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        (uintmax_t)in_stack_fffffffffffffe68,uVar7);
          }
          break;
        case 'c':
          if (*(uint *)&in_RDX->s < 0x29) {
            *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
          }
          else {
            in_RDX->length = in_RDX->length + 8;
          }
          archive_strappend_char(in_stack_fffffffffffffe60,c);
          break;
        case 'd':
          if (local_19 == 'j') {
            if (*(uint *)&in_RDX->s < 0x29) {
              *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
          }
          else if (local_19 == 'l') {
            if (*(uint *)&in_RDX->s < 0x29) {
              *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
          }
          else if (local_19 == 'z') {
            if (*(uint *)&in_RDX->s < 0x29) {
              *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
          }
          else if (*(uint *)&in_RDX->s < 0x29) {
            *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
          }
          else {
            in_RDX->length = in_RDX->length + 8;
          }
          append_int((archive_string *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                     ,(intmax_t)in_stack_fffffffffffffe68,
                     (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20));
          break;
        case 's':
          if (local_19 == 'l') {
            uVar7 = *(uint *)&in_RDX->s;
            if (uVar7 < 0x29) {
              local_f0 = (long *)((long)(int)uVar7 + in_RDX->buffer_length);
              *(uint *)&in_RDX->s = uVar7 + 8;
            }
            else {
              local_f0 = (long *)in_RDX->length;
              in_RDX->length = (size_t)(local_f0 + 1);
            }
            local_48 = (wchar_t *)*local_f0;
            if (local_48 == (wchar_t *)0x0) {
              local_48 = anon_var_dwarf_11536;
            }
            wcslen(local_48);
            wVar3 = archive_string_append_from_wcs
                              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            if ((wVar3 != L'\0') && (piVar6 = __errno_location(), *piVar6 == 0xc)) {
              __archive_errx(in_stack_fffffffffffffe74,(char *)in_stack_fffffffffffffe68);
            }
          }
          else {
            if (*(uint *)&in_RDX->s < 0x29) {
              *(uint *)&in_RDX->s = *(uint *)&in_RDX->s + 8;
            }
            else {
              in_RDX->length = in_RDX->length + 8;
            }
            archive_strcat(in_stack_fffffffffffffe60,
                           (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          }
        }
      }
      else {
        archive_strappend_char(in_stack_fffffffffffffe60,c);
        local_38 = pcVar2;
      }
    }
  }
  return;
}

Assistant:

void
archive_string_vsprintf(struct archive_string *as, const char *fmt,
    va_list ap)
{
	char long_flag;
	intmax_t s; /* Signed integer temp. */
	uintmax_t u; /* Unsigned integer temp. */
	const char *p, *p2;
	const wchar_t *pw;

	if (archive_string_ensure(as, 64) == NULL)
		__archive_errx(1, "Out of memory");

	if (fmt == NULL) {
		as->s[0] = 0;
		return;
	}

	for (p = fmt; *p != '\0'; p++) {
		const char *saved_p = p;

		if (*p != '%') {
			archive_strappend_char(as, *p);
			continue;
		}

		p++;

		long_flag = '\0';
		switch(*p) {
		case 'j':
		case 'l':
		case 'z':
			long_flag = *p;
			p++;
			break;
		}

		switch (*p) {
		case '%':
			archive_strappend_char(as, '%');
			break;
		case 'c':
			s = va_arg(ap, int);
			archive_strappend_char(as, (char)s);
			break;
		case 'd':
			switch(long_flag) {
			case 'j': s = va_arg(ap, intmax_t); break;
			case 'l': s = va_arg(ap, long); break;
			case 'z': s = va_arg(ap, ssize_t); break;
			default:  s = va_arg(ap, int); break;
			}
		        append_int(as, s, 10);
			break;
		case 's':
			switch(long_flag) {
			case 'l':
				pw = va_arg(ap, wchar_t *);
				if (pw == NULL)
					pw = L"(null)";
				if (archive_string_append_from_wcs(as, pw,
				    wcslen(pw)) != 0 && errno == ENOMEM)
					__archive_errx(1, "Out of memory");
				break;
			default:
				p2 = va_arg(ap, char *);
				if (p2 == NULL)
					p2 = "(null)";
				archive_strcat(as, p2);
				break;
			}
			break;
		case 'S':
			pw = va_arg(ap, wchar_t *);
			if (pw == NULL)
				pw = L"(null)";
			if (archive_string_append_from_wcs(as, pw,
			    wcslen(pw)) != 0 && errno == ENOMEM)
				__archive_errx(1, "Out of memory");
			break;
		case 'o': case 'u': case 'x': case 'X':
			/* Common handling for unsigned integer formats. */
			switch(long_flag) {
			case 'j': u = va_arg(ap, uintmax_t); break;
			case 'l': u = va_arg(ap, unsigned long); break;
			case 'z': u = va_arg(ap, size_t); break;
			default:  u = va_arg(ap, unsigned int); break;
			}
			/* Format it in the correct base. */
			switch (*p) {
			case 'o': append_uint(as, u, 8); break;
			case 'u': append_uint(as, u, 10); break;
			default: append_uint(as, u, 16); break;
			}
			break;
		default:
			/* Rewind and print the initial '%' literally. */
			p = saved_p;
			archive_strappend_char(as, *p);
		}
	}
}